

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O0

void __thiscall
iu_UnitStringTest_x_iutest_x_StringToValueException_Test::
iu_UnitStringTest_x_iutest_x_StringToValueException_Test
          (iu_UnitStringTest_x_iutest_x_StringToValueException_Test *this)

{
  iu_UnitStringTest_x_iutest_x_StringToValueException_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_UnitStringTest_x_iutest_x_StringToValueException_Test_001f2b98;
  return;
}

Assistant:

IUTEST(UnitStringTest, StringToValueException)
{
    {
        float f = -10.0f;
        IUTEST_EXPECT_THROW(::iutest::detail::StringToValue("ABC", f), ::std::invalid_argument);
        IUTEST_EXPECT_FLOAT_EQ(-10.0f, f);
    }
    {
        float f = -10.0f;
        IUTEST_EXPECT_THROW(::iutest::detail::StringToValue("123456789e1000", f), ::std::out_of_range);
        IUTEST_EXPECT_FLOAT_EQ(-10.0f, f);
    }
    {
        double f = -10.0;
        IUTEST_EXPECT_THROW(::iutest::detail::StringToValue("ABC", f), ::std::invalid_argument);
        IUTEST_EXPECT_DOUBLE_EQ(-10.0, f);
    }
    {
        double f = -10.0;
        IUTEST_EXPECT_THROW(::iutest::detail::StringToValue("123456789e1000", f), ::std::out_of_range);
        IUTEST_EXPECT_DOUBLE_EQ(-10.0, f);
    }
#if IUTEST_HAS_LONG_DOUBLE
    {
        long double f = -10.0l;
        IUTEST_EXPECT_THROW(::iutest::detail::StringToValue("ABC", f), ::std::invalid_argument);
        IUTEST_EXPECT_LONG_DOUBLE_EQ(-10.0l, f);
    }
    {
        long double f = -10.0l;
        IUTEST_EXPECT_THROW(::iutest::detail::StringToValue("123456789e1000000", f), ::std::out_of_range);
        IUTEST_EXPECT_LONG_DOUBLE_EQ(-10.0l, f);
    }
#endif
}